

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChLinePath::ArchiveOUT(ChLinePath *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_60;
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_48;
  ChNameValue<std::vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>_>
  local_30;
  
  ChArchiveOut::VersionWrite<chrono::geometry::ChLinePath>(marchive);
  ChLine::ArchiveOUT(&this->super_ChLine,marchive);
  local_30._value = &this->lines;
  local_30._name = "lines";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->end_times;
  local_48._name = "end_times";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->durations;
  local_60._name = "durations";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  return;
}

Assistant:

void ChLinePath::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinePath>();
    // serialize parent class
    ChLine::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(lines);
    marchive << CHNVP(end_times);
    marchive << CHNVP(durations);
}